

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  Bitmap bitmap;
  unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_> document;
  uint32_t bgColor;
  uint32_t height;
  uint32_t width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> basename;
  string filename;
  _Head_base<0UL,_lunasvg::SVGRootElement_*,_false> local_70;
  __uniq_ptr_impl<lunasvg::Document,_std::default_delete<lunasvg::Document>_> local_68;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t local_54;
  string local_50;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  bVar1 = setup(argc,argv,&local_30,&local_54,&local_58,&local_5c);
  if (bVar1) {
    lunasvg::Document::loadFromFile((Document *)&local_68,&local_30);
    if (local_68._M_t.
        super__Tuple_impl<0UL,_lunasvg::Document_*,_std::default_delete<lunasvg::Document>_>.
        super__Head_base<0UL,_lunasvg::Document_*,_false>._M_head_impl ==
        (_Tuple_impl<0UL,_lunasvg::Document_*,_std::default_delete<lunasvg::Document>_>)0x0) {
      iVar4 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Usage: \n   svg2png [filename] [resolution] [bgColor]\n\nExamples: \n    $ svg2png input.svg\n    $ svg2png input.svg 512x512\n    $ svg2png input.svg 512x512 0xff00ffff\n\n"
                 ,0xa5);
    }
    else {
      lunasvg::Document::renderToBitmap
                ((Document *)&local_70,
                 (int)local_68._M_t.
                      super__Tuple_impl<0UL,_lunasvg::Document_*,_std::default_delete<lunasvg::Document>_>
                      .super__Head_base<0UL,_lunasvg::Document_*,_false>._M_head_impl,local_54,
                 local_58);
      if (local_70._M_head_impl == (SVGRootElement *)0x0) {
        iVar4 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Usage: \n   svg2png [filename] [resolution] [bgColor]\n\nExamples: \n    $ svg2png input.svg\n    $ svg2png input.svg 512x512\n    $ svg2png input.svg 512x512 0xff00ffff\n\n"
                   ,0xa5);
      }
      else {
        lVar2 = std::__cxx11::string::find_last_of((char *)&local_30,0x1430aa,0xffffffffffffffff);
        if (lVar2 == -1) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_30._M_dataplus._M_p,
                     local_30._M_dataplus._M_p + local_30._M_string_length);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_30);
        }
        std::__cxx11::string::append((char *)&local_50);
        lunasvg::Bitmap::writeToPng((Bitmap *)&local_70,&local_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Generated PNG file: ",0x14);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                            local_50._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        iVar4 = 0;
      }
      lunasvg::Bitmap::~Bitmap((Bitmap *)&local_70);
    }
    std::unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_>::~unique_ptr
              ((unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_> *)&local_68);
  }
  else {
    iVar4 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Usage: \n   svg2png [filename] [resolution] [bgColor]\n\nExamples: \n    $ svg2png input.svg\n    $ svg2png input.svg 512x512\n    $ svg2png input.svg 512x512 0xff00ffff\n\n"
               ,0xa5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
    std::string filename;
    std::uint32_t width = 0, height = 0;
    std::uint32_t bgColor = 0x00000000;
    if(!setup(argc, argv, filename, width, height, bgColor)) {
        return help();
    }

    auto document = Document::loadFromFile(filename);
    if(document == nullptr) {
        return help();
    }

    auto bitmap = document->renderToBitmap(width, height, bgColor);
    if(bitmap.isNull()) {
        return help();
    }

    auto lastSlashIndex = filename.find_last_of("/\\");
    auto basename = lastSlashIndex == std::string::npos ? filename : filename.substr(lastSlashIndex + 1);
    basename.append(".png");

    bitmap.writeToPng(basename);
    std::cout << "Generated PNG file: " << basename << std::endl;
    return 0;
}